

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

bool __thiscall IR::Instr::IsRealInstr(Instr *this)

{
  OpCode OVar1;
  bool bVar2;
  
  OVar1 = this->m_opcode;
  if ((((0x35 < OVar1 - 0x212) ||
       (bVar2 = false, (0x30000000000003U >> ((ulong)(OVar1 - 0x212) & 0x3f) & 1) == 0)) &&
      (bVar2 = false, OVar1 != Label)) && (bVar2 = false, OVar1 != StatementBoundary)) {
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool
Instr::IsRealInstr() const
{
    switch (m_opcode)
    {
    case Js::OpCode::Label:
    case Js::OpCode::StatementBoundary:
    case Js::OpCode::NoImplicitCallUses:
    case Js::OpCode::NoIntOverflowBoundary:
#if DBG
    case Js::OpCode::CheckLowerIntBound:
    case Js::OpCode::CheckUpperIntBound:
#endif
        return false;

    default:
        return true;
    }
}